

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O0

DdNode * Cudd_bddTransferPermute
                   (DdManager *ddSource,DdManager *ddDestination,DdNode *f,int *Permute)

{
  DdNode *pDVar1;
  DdNode *res;
  int *Permute_local;
  DdNode *f_local;
  DdManager *ddDestination_local;
  DdManager *ddSource_local;
  
  do {
    ddDestination->reordered = 0;
    pDVar1 = cuddBddTransferPermute(ddSource,ddDestination,f,Permute);
  } while (ddDestination->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddTransferPermute( DdManager * ddSource,
                  DdManager * ddDestination, DdNode * f, int * Permute )
{
    DdNode *res;
    do
    {
        ddDestination->reordered = 0;
        res = cuddBddTransferPermute( ddSource, ddDestination, f, Permute );
    }
    while ( ddDestination->reordered == 1 );
    return ( res );

}